

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  float fVar1;
  bool bVar2;
  ImVec2 IVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  long *in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  int *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float char_width;
  uint c;
  char *prev_s;
  char *s;
  char *word_wrap_eol;
  bool word_wrap_enabled;
  float line_width;
  float scale;
  float line_height;
  ImVec2 text_size;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff98;
  uint *puVar8;
  uint *local_58;
  uint *local_50;
  float local_44;
  uint *local_30;
  uint *puVar9;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar10;
  int *piVar11;
  float in_stack_fffffffffffffff8;
  float in_stack_fffffffffffffffc;
  
  local_30 = in_RDX;
  local_58 = in_RSI;
  piVar11 = in_RDI;
  if (in_RDX == (uint *)0x0) {
    sVar7 = strlen((char *)in_RSI);
    local_30 = (uint *)((long)in_RSI + sVar7);
  }
  fVar1 = (float)in_RDI[5];
  fVar10 = in_XMM0_Da;
  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffff8,0.0,0.0);
  local_44 = 0.0;
  bVar2 = in_XMM2_Da <= 0.0;
  local_50 = (uint *)0x0;
  puVar9 = local_58;
LAB_004e2749:
  do {
    puVar4 = local_58;
    if (local_30 <= local_58) {
LAB_004e294d:
      local_58 = puVar4;
      if (in_stack_fffffffffffffff8 < local_44) {
        in_stack_fffffffffffffff8 = local_44;
      }
      if ((0.0 < local_44) ||
         ((in_stack_fffffffffffffffc == 0.0 && (!NAN(in_stack_fffffffffffffffc))))) {
        in_stack_fffffffffffffffc = in_XMM0_Da + in_stack_fffffffffffffffc;
      }
      if (in_RCX != (long *)0x0) {
        *in_RCX = (long)local_58;
      }
      IVar3.y = in_stack_fffffffffffffffc;
      IVar3.x = in_stack_fffffffffffffff8;
      return IVar3;
    }
    if (bVar2) {
LAB_004e280b:
      uVar5 = (uint)(char)*local_58;
      puVar8 = local_58;
      if (uVar5 < 0x80) {
        local_58 = (uint *)((long)local_58 + 1);
      }
      else {
        iVar6 = ImTextCharFromUtf8(local_58,(char *)CONCAT44(uVar5,in_stack_ffffffffffffff98),
                                   (char *)in_RDI);
        local_58 = (uint *)((long)local_58 + (long)iVar6);
        puVar4 = local_58;
        if (uVar5 == 0) goto LAB_004e294d;
      }
      if (uVar5 < 0x20) {
        if (uVar5 == 10) {
          in_stack_fffffffffffffff8 = ImMax<float>(in_stack_fffffffffffffff8,local_44);
          in_stack_fffffffffffffffc = in_XMM0_Da + in_stack_fffffffffffffffc;
          local_44 = 0.0;
          goto LAB_004e2749;
        }
        if (uVar5 == 0xd) goto LAB_004e2749;
      }
      if ((int)uVar5 < *in_RDI) {
        in_stack_ffffffffffffff84 = *(float *)(*(long *)(in_RDI + 2) + (ulong)uVar5 * 4);
      }
      else {
        in_stack_ffffffffffffff84 = (float)in_RDI[4];
      }
      in_stack_ffffffffffffff98 = in_stack_ffffffffffffff84 * (in_XMM0_Da / fVar1);
      puVar4 = puVar8;
      if (in_XMM1_Da <= local_44 + in_stack_ffffffffffffff98) goto LAB_004e294d;
      local_44 = in_stack_ffffffffffffff98 + local_44;
      goto LAB_004e2749;
    }
    if (local_50 == (uint *)0x0) {
      local_50 = (uint *)CalcWordWrapPositionA
                                   ((ImFont *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    (float)((ulong)piVar11 >> 0x20),
                                    (char *)CONCAT44(fVar10,in_XMM1_Da),
                                    (char *)CONCAT44(in_XMM2_Da,in_stack_ffffffffffffffe0),
                                    (float)((ulong)puVar9 >> 0x20));
    }
    if (local_58 < local_50) goto LAB_004e280b;
    if (in_stack_fffffffffffffff8 < local_44) {
      in_stack_fffffffffffffff8 = local_44;
    }
    in_stack_fffffffffffffffc = in_XMM0_Da + in_stack_fffffffffffffffc;
    local_44 = 0.0;
    local_50 = (uint *)0x0;
    local_58 = (uint *)CalcWordWrapNextLineStartA
                                 ((char *)CONCAT44(in_stack_ffffffffffffff84,
                                                   in_stack_ffffffffffffff80),
                                  in_stack_ffffffffffffff78);
  } while( true );
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;
                s = CalcWordWrapNextLineStartA(s, text_end); // Wrapping skips upcoming blanks
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}